

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layout.h
# Opt level: O3

void __thiscall Iir::LayoutBase::add(LayoutBase *this,ComplexPair *poles,ComplexPair *zeros)

{
  complex<double> *pcVar1;
  double dVar2;
  double dVar3;
  PoleZeroPair *pPVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  invalid_argument *this_00;
  
  if ((this->m_numPoles & 1U) != 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Can\'t add 2nd order after a 1st order filter.");
    goto LAB_001047b9;
  }
  dVar2 = *(double *)((poles->super_complex_pair_t).first._M_value + 8);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    dVar3 = *(double *)(poles->super_complex_pair_t).second._M_value;
    if ((dVar3 == *(double *)(poles->super_complex_pair_t).first._M_value) &&
       (!NAN(dVar3) && !NAN(*(double *)(poles->super_complex_pair_t).first._M_value))) {
      dVar3 = *(double *)((poles->super_complex_pair_t).second._M_value + 8);
      if ((dVar3 == -dVar2) && (!NAN(dVar3) && !NAN(-dVar2))) goto LAB_00104687;
    }
  }
  else {
    dVar2 = *(double *)((poles->super_complex_pair_t).second._M_value + 8);
    if (((dVar2 == 0.0) &&
        ((!NAN(dVar2) &&
         ((dVar2 = *(double *)(poles->super_complex_pair_t).second._M_value, dVar2 != 0.0 ||
          (NAN(dVar2))))))) &&
       ((dVar2 = *(double *)(poles->super_complex_pair_t).first._M_value, dVar2 != 0.0 ||
        (NAN(dVar2))))) {
LAB_00104687:
      dVar2 = *(double *)((zeros->super_complex_pair_t).first._M_value + 8);
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        dVar3 = *(double *)(zeros->super_complex_pair_t).second._M_value;
        if ((dVar3 == *(double *)(zeros->super_complex_pair_t).first._M_value) &&
           (!NAN(dVar3) && !NAN(*(double *)(zeros->super_complex_pair_t).first._M_value))) {
          dVar3 = *(double *)((zeros->super_complex_pair_t).second._M_value + 8);
          if ((dVar3 == -dVar2) && (!NAN(dVar3) && !NAN(-dVar2))) goto LAB_00104705;
        }
      }
      else {
        dVar2 = *(double *)((zeros->super_complex_pair_t).second._M_value + 8);
        if (((dVar2 == 0.0) &&
            ((!NAN(dVar2) &&
             ((dVar2 = *(double *)(zeros->super_complex_pair_t).second._M_value, dVar2 != 0.0 ||
              (NAN(dVar2))))))) &&
           ((dVar2 = *(double *)(zeros->super_complex_pair_t).first._M_value, dVar2 != 0.0 ||
            (NAN(dVar2))))) {
LAB_00104705:
          uVar5 = *(undefined8 *)(poles->super_complex_pair_t).second._M_value;
          uVar6 = *(undefined8 *)((poles->super_complex_pair_t).second._M_value + 8);
          uVar7 = *(undefined8 *)(zeros->super_complex_pair_t).first._M_value;
          uVar8 = *(undefined8 *)((zeros->super_complex_pair_t).first._M_value + 8);
          uVar9 = *(undefined8 *)(zeros->super_complex_pair_t).second._M_value;
          uVar10 = *(undefined8 *)((zeros->super_complex_pair_t).second._M_value + 8);
          pPVar4 = this->m_pair;
          iVar12 = this->m_numPoles >> 1;
          uVar11 = *(undefined8 *)((poles->super_complex_pair_t).first._M_value + 8);
          *(undefined8 *)pPVar4[iVar12].poles.super_complex_pair_t.first._M_value =
               *(undefined8 *)(poles->super_complex_pair_t).first._M_value;
          *(undefined8 *)(pPVar4[iVar12].poles.super_complex_pair_t.first._M_value + 8) = uVar11;
          pcVar1 = &pPVar4[iVar12].poles.super_complex_pair_t.second;
          *(undefined8 *)pcVar1->_M_value = uVar5;
          *(undefined8 *)(pcVar1->_M_value + 8) = uVar6;
          *(undefined8 *)pPVar4[iVar12].zeros.super_complex_pair_t.first._M_value = uVar7;
          *(undefined8 *)(pPVar4[iVar12].zeros.super_complex_pair_t.first._M_value + 8) = uVar8;
          pcVar1 = &pPVar4[iVar12].zeros.super_complex_pair_t.second;
          *(undefined8 *)pcVar1->_M_value = uVar9;
          *(undefined8 *)(pcVar1->_M_value + 8) = uVar10;
          this->m_numPoles = this->m_numPoles + 2;
          return;
        }
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Zeros not complex conjugate.");
      goto LAB_001047b9;
    }
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Poles not complex conjugate.");
LAB_001047b9:
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void add (const ComplexPair& poles, const ComplexPair& zeros)
		{
			if (m_numPoles&1)
				throw_invalid_argument(errCantAdd2ndOrder);
			if (!poles.isMatchedPair ())
				throw_invalid_argument(errPolesNotComplexConj);
			if (!zeros.isMatchedPair ())
				throw_invalid_argument(errZerosNotComplexConj);
			m_pair[m_numPoles/2] = PoleZeroPair (poles.first, zeros.first,
							     poles.second, zeros.second);
			m_numPoles += 2;
		}